

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanStringTemplateBegin
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp)

{
  EncodedCharPtr puVar1;
  EncodedCharPtr puVar2;
  EncodedCharPtr puVar3;
  EncodedCharPtr puVar4;
  
  Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
            ((Scanner<UTF8EncodingPolicyBase<false>> *)this,L'`',pp);
  puVar2 = this->m_pchLast;
  puVar3 = *pp;
  puVar1 = puVar3 + 1;
  *pp = puVar1;
  puVar4 = puVar1;
  if (puVar3 < puVar2) {
    if (*puVar3 == '`') {
      return tkStrTmplBasic;
    }
    if (*puVar3 == '$') {
      puVar4 = puVar3 + 2;
      *pp = puVar4;
      if ((puVar1 < puVar2) && (*puVar1 == '{')) {
        this->m_fStringTemplateDepth = this->m_fStringTemplateDepth + 1;
        return tkStrTmplBegin;
      }
    }
  }
  *pp = puVar4 + -1;
  this->m_ptoken->tk = tkLastKwd;
  return tkLastKwd;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringTemplateBegin(EncodedCharPtr *pp)
{
    // String template must begin with a string constant followed by '`' or '${'
    ScanStringConstant<true, true>('`', pp);

    OLECHAR ch;
    EncodedCharPtr last = m_pchLast;

    ch = this->ReadFirst(*pp, last);

    if (ch == '`')
    {
        // Simple string template - no substitutions
        return tkStrTmplBasic;
    }
    else if (ch == '$')
    {
        ch = this->ReadFirst(*pp, last);

        if (ch == '{')
        {
            // Next token after expr should be tkStrTmplMid or tkStrTmplEnd.
            // In string template scanning mode, we expect the next char to be '}'
            // and will treat it as the beginning of tkStrTmplEnd or tkStrTmplMid
            m_fStringTemplateDepth++;

            // Regular string template begin - next is first substitution
            return tkStrTmplBegin;
        }
    }

    // Error - make sure pointer stays at the last character of the error token instead of after it in the error case
    (*pp)--;
    return ScanError(m_currentCharacter, tkStrTmplBegin);
}